

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.cpp
# Opt level: O2

COMPONENT_TYPE
Diligent::CheckSparseTextureFormatSupport
          (TEXTURE_FORMAT TexFormat,RESOURCE_DIMENSION Dimension,Uint32 SampleCount,
          SparseResourceProperties *SparseRes)

{
  undefined1 uVar1;
  TextureFormatAttribs *pTVar2;
  uint uVar3;
  undefined7 in_register_00000031;
  string msg;
  string local_38;
  
  switch((int)CONCAT71(in_register_00000031,Dimension)) {
  case 1:
  case 2:
  case 3:
    FormatString<char[42]>(&local_38,(char (*) [42])"Invalid sparse texture resource dimension");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"CheckSparseTextureFormatSupport",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderDeviceBase.cpp"
               ,0xb6);
    goto LAB_005e2000;
  case 4:
  case 5:
    if ((SparseRes->CapFlags & SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D) == SPARSE_RESOURCE_CAP_FLAG_NONE
       ) {
      return COMPONENT_TYPE_UNDEFINED;
    }
    uVar3 = SampleCount ^ SampleCount - 1;
    if (uVar3 <= SampleCount - 1) {
      FormatString<char[26],char[26]>
                (&local_38,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"IsPowerOfTwo(SampleCount)",(char (*) [26])(ulong)uVar3);
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"CheckSparseTextureFormatSupport",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderDeviceBase.cpp"
                 ,0xa1);
      std::__cxx11::string::~string((string *)&local_38);
    }
    if ((1 < SampleCount) &&
       ((SampleCount << 3 & SparseRes->CapFlags &
        ~(SPARSE_RESOURCE_CAP_FLAG_TEXTURE_3D|SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D|
          SPARSE_RESOURCE_CAP_FLAG_BUFFER|SPARSE_RESOURCE_CAP_FLAG_SHADER_RESOURCE_RESIDENCY)) ==
        SPARSE_RESOURCE_CAP_FLAG_NONE)) {
      return COMPONENT_TYPE_UNDEFINED;
    }
    goto LAB_005e1fc8;
  case 6:
    if (SampleCount != 1) {
      FormatString<char[41]>(&local_38,(char (*) [41])"Multisampled texture 3D is not supported");
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"CheckSparseTextureFormatSupport",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderDeviceBase.cpp"
                 ,0xae);
      std::__cxx11::string::~string((string *)&local_38);
    }
    uVar1 = (char)SparseRes->CapFlags & SPARSE_RESOURCE_CAP_FLAG_TEXTURE_3D;
    break;
  case 7:
  case 8:
    uVar1 = (char)SparseRes->CapFlags & SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D;
    break;
  default:
    FormatString<char[30]>(&local_38,(char (*) [30])"Unexpected resource dimension");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"CheckSparseTextureFormatSupport",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderDeviceBase.cpp"
               ,0xba);
LAB_005e2000:
    std::__cxx11::string::~string((string *)&local_38);
    return COMPONENT_TYPE_UNDEFINED;
  }
  if (uVar1 == SPARSE_RESOURCE_CAP_FLAG_NONE) {
    return COMPONENT_TYPE_UNDEFINED;
  }
LAB_005e1fc8:
  pTVar2 = GetTextureFormatAttribs(TexFormat);
  return pTVar2->ComponentType;
}

Assistant:

COMPONENT_TYPE CheckSparseTextureFormatSupport(TEXTURE_FORMAT                  TexFormat,
                                               RESOURCE_DIMENSION              Dimension,
                                               Uint32                          SampleCount,
                                               const SparseResourceProperties& SparseRes) noexcept
{
    switch (Dimension)
    {
        case RESOURCE_DIM_TEX_2D:
        case RESOURCE_DIM_TEX_2D_ARRAY:
        {
            if ((SparseRes.CapFlags & SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D) == 0)
                return COMPONENT_TYPE_UNDEFINED;

            static_assert(SPARSE_RESOURCE_CAP_FLAG_TEXTURE_4_SAMPLES == SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2_SAMPLES * 2, "Unexpected enum values");
            static_assert(SPARSE_RESOURCE_CAP_FLAG_TEXTURE_8_SAMPLES == SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2_SAMPLES * 4, "Unexpected enum values");
            static_assert(SPARSE_RESOURCE_CAP_FLAG_TEXTURE_16_SAMPLES == SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2_SAMPLES * 8, "Unexpected enum values");
            VERIFY_EXPR(IsPowerOfTwo(SampleCount));
            if (SampleCount >= 2 && (SparseRes.CapFlags & (SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2_SAMPLES * (SampleCount >> 1))) == 0)
                return COMPONENT_TYPE_UNDEFINED;

            break;
        }
        case RESOURCE_DIM_TEX_CUBE:
        case RESOURCE_DIM_TEX_CUBE_ARRAY:
            if ((SparseRes.CapFlags & SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D) == 0)
                return COMPONENT_TYPE_UNDEFINED;
            break;

        case RESOURCE_DIM_TEX_3D:
            DEV_CHECK_ERR(SampleCount == 1, "Multisampled texture 3D is not supported");
            if ((SparseRes.CapFlags & SPARSE_RESOURCE_CAP_FLAG_TEXTURE_3D) == 0)
                return COMPONENT_TYPE_UNDEFINED;
            break;

        case RESOURCE_DIM_BUFFER:
        case RESOURCE_DIM_TEX_1D:
        case RESOURCE_DIM_TEX_1D_ARRAY:
            DEV_ERROR("Invalid sparse texture resource dimension");
            return COMPONENT_TYPE_UNDEFINED;

        default:
            DEV_ERROR("Unexpected resource dimension");
            return COMPONENT_TYPE_UNDEFINED;
    }

    return GetTextureFormatAttribs(TexFormat).ComponentType;
}